

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestRunScriptCommand.cxx
# Opt level: O2

bool __thiscall
cmCTestRunScriptCommand::InitialPass
          (cmCTestRunScriptCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  cmMakefile *this_00;
  bool bVar1;
  bool bVar2;
  pointer pbVar3;
  pointer pbVar4;
  uint uVar5;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  string_view value;
  int ret;
  string returnVariable;
  int local_74;
  string local_70;
  string local_50;
  
  __lhs = (args->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
  if (__lhs == (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish) {
    cmCTestScriptHandler::RunCurrentScript((this->super_cmCTestCommand).CTestScriptHandler);
  }
  else {
    bVar1 = std::operator==(__lhs,"NEW_PROCESS");
    uVar8 = (ulong)bVar1;
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    local_70._M_string_length = 0;
    local_70.field_2._M_local_buf[0] = '\0';
    uVar6 = uVar8;
    while( true ) {
      uVar5 = (uint)uVar6;
      pbVar4 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      pbVar3 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      if ((ulong)((long)pbVar3 - (long)pbVar4 >> 5) <= uVar6) break;
      bVar2 = std::operator==(pbVar4 + uVar6,"RETURN_VALUE");
      if ((bVar2) &&
         (uVar5 = uVar5 + 1,
         (ulong)uVar5 <
         (ulong)((long)(args->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish -
                 (long)(args->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start >> 5))) {
        std::__cxx11::string::_M_assign((string *)&local_70);
      }
      uVar6 = (ulong)(uVar5 + 1);
    }
    while (iVar7 = (int)uVar8, uVar8 < (ulong)((long)pbVar3 - (long)pbVar4 >> 5)) {
      bVar2 = std::operator==(pbVar4 + uVar8,"RETURN_VALUE");
      if (bVar2) {
        iVar7 = iVar7 + 1;
      }
      else {
        cmCTestScriptHandler::RunScript
                  ((this->super_cmCTestCommand).CTest,
                   (this->super_cmCTestCommand).super_cmCommand.Makefile,
                   (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start + uVar8,!bVar1,&local_74);
        this_00 = (this->super_cmCTestCommand).super_cmCommand.Makefile;
        std::__cxx11::to_string(&local_50,local_74);
        value._M_str = local_50._M_dataplus._M_p;
        value._M_len = local_50._M_string_length;
        cmMakefile::AddDefinition(this_00,&local_70,value);
        std::__cxx11::string::~string((string *)&local_50);
      }
      pbVar4 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      pbVar3 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      uVar8 = (ulong)(iVar7 + 1);
    }
    std::__cxx11::string::~string((string *)&local_70);
  }
  return true;
}

Assistant:

bool cmCTestRunScriptCommand::InitialPass(std::vector<std::string> const& args,
                                          cmExecutionStatus& /*unused*/)
{
  if (args.empty()) {
    this->CTestScriptHandler->RunCurrentScript();
    return true;
  }

  bool np = false;
  unsigned int i = 0;
  if (args[i] == "NEW_PROCESS") {
    np = true;
    i++;
  }
  int start = i;
  // run each script
  std::string returnVariable;
  for (i = start; i < args.size(); ++i) {
    if (args[i] == "RETURN_VALUE") {
      ++i;
      if (i < args.size()) {
        returnVariable = args[i];
      }
    }
  }
  for (i = start; i < args.size(); ++i) {
    if (args[i] == "RETURN_VALUE") {
      ++i;
    } else {
      int ret;
      cmCTestScriptHandler::RunScript(this->CTest, this->Makefile, args[i],
                                      !np, &ret);
      this->Makefile->AddDefinition(returnVariable, std::to_string(ret));
    }
  }
  return true;
}